

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0258(ParserTester *this)

{
  ParseOptions parseOpts;
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  ParseOptions local_240;
  allocator<psy::C::SyntaxKind> local_219;
  SyntaxKind local_218 [28];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"void x ( int * y , int ( * z ) ( w * ) ) ;",&local_31);
  Expectation::Expectation(&local_1b8);
  local_218[0x10] = 0x419;
  local_218[0x11] = ParameterDeclaration;
  local_218[0x12] = TypedefName;
  local_218[0x13] = PointerDeclarator;
  local_218[0x14] = AbstractDeclarator;
  local_218[8] = PointerDeclarator;
  local_218[9] = IdentifierDeclarator;
  local_218[10] = ParameterDeclaration;
  local_218[0xb] = BasicTypeSpecifier;
  local_218[0xc] = 0x416;
  local_218[0xd] = ParenthesizedDeclarator;
  local_218[0xe] = PointerDeclarator;
  local_218[0xf] = IdentifierDeclarator;
  local_218[0] = STARTof_Node;
  local_218[1] = VariableAndOrFunctionDeclaration;
  local_218[2] = VoidTypeSpecifier;
  local_218[3] = FunctionDeclarator;
  local_218[4] = IdentifierDeclarator;
  local_218[5] = ParameterSuffix;
  local_218[6] = ParameterDeclaration;
  local_218[7] = BasicTypeSpecifier;
  local_1e0 = local_218;
  local_1d8 = 0x15;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_219);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_219);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions(&local_240);
  parseOpts.langExts_.translations_.field_0 = local_240.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_240.langDialect_.std_;
  parseOpts._1_7_ = local_240._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_240.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_240.field_2;
  parseOpts._26_6_ = local_240._26_6_;
  parse(this,&local_30,&local_100,Any,parseOpts);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_219);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case0258()
{
    parse("void x ( int * y , int ( * z ) ( w * ) ) ;",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::VariableAndOrFunctionDeclaration,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::ParenthesizedDeclarator,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::TypedefName,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::AbstractDeclarator }));
}